

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_encoder.cpp
# Opt level: O2

void __thiscall
encoder_Hx_benchmark_Test::encoder_Hx_benchmark_Test(encoder_Hx_benchmark_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00183420;
  return;
}

Assistant:

TEST(encoder, Hx_benchmark) {
    std::array<Bit, AutogenLDPC::N> input{};
    std::array<Bit, AutogenLDPC::M> output{};

    constexpr int num_runs = 1000;
    unsigned int seed = 0;
    long long runtime = 0;

    std::cout << "Performing " << num_runs
        << " encodings for matrix size " << AutogenLDPC::M << " x " << AutogenLDPC::N << std::endl;
    std::cout << "Matrix has " << AutogenLDPC::num_nz << " non-zero entries." << std::endl;

    for (; seed < num_runs; ++seed) {
        noise_bitstring_inplace(input, 0.5, seed);

        auto begin = std::chrono::steady_clock::now();

        encode(input, output);

        auto now = std::chrono::steady_clock::now();

        auto elapsed = std::chrono::duration_cast<std::chrono::microseconds>(now - begin);
        runtime += elapsed.count();
        std::cout << "\rHash every run (makes sure the result is not optimized away): " << hash_vector(output);
    }
    std::cout << "\nAvg. runtime: " << static_cast<double>(runtime) / num_runs << " microseconds." << std::endl;
}